

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

PmError Pm_WriteSysEx(PortMidiStream *stream,PmTimestamp when,uchar *msg)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  PmError PVar4;
  int iVar5;
  char cVar6;
  PmError unaff_EBP;
  byte *pbVar7;
  int length;
  int iVar8;
  PmEvent buffer [256];
  PmEvent local_838 [257];
  
  local_838[0].timestamp = when;
  local_838[0].message = (uint)*msg;
  if (*msg == 0xf7) {
    iVar5 = 1;
  }
  else {
    iVar8 = 0;
    length = 1;
    iVar5 = 8;
    do {
      pbVar7 = msg + 1;
      msg = pbVar7;
      if (iVar5 == 0x20) {
        iVar8 = iVar8 + 1;
        if (iVar8 == length) {
          PVar4 = Pm_Write(stream,local_838,length);
          if (PVar4 == pmNoData) {
            length = 0x100;
            iVar8 = 0;
            if (*(long *)((long)stream + 0x60) == 0) {
              cVar6 = '\0';
            }
            else {
              do {
                uVar2 = **(uint **)((long)stream + 0x68);
                if (*(uint *)((long)stream + 0x70) <= uVar2) {
                  length = 1;
                  cVar6 = '\0';
                  msg = pbVar7;
                  goto LAB_00104d89;
                }
                bVar1 = *pbVar7;
                lVar3 = *(long *)((long)stream + 0x60);
                **(uint **)((long)stream + 0x68) = uVar2 + 1;
                *(byte *)(lVar3 + (ulong)uVar2) = bVar1;
                msg = pbVar7 + 1;
                bVar1 = *pbVar7;
                pbVar7 = msg;
              } while (bVar1 != 0xf7);
              PVar4 = (**(code **)(*(long *)((long)stream + 0x50) + 0x10))(stream,0);
              *(undefined4 *)((long)stream + 0x2c) = 0;
              if (PVar4 == pmHostError) {
                (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100)
                ;
                pm_hosterror = 1;
              }
              cVar6 = (PVar4 == pmNoData) * '\x05' + '\x01';
              if (PVar4 != pmNoData) {
                unaff_EBP = PVar4;
              }
            }
          }
          else {
            cVar6 = '\x01';
            unaff_EBP = PVar4;
          }
LAB_00104d89:
          if (cVar6 != '\0') {
            iVar5 = 0;
            if (cVar6 != '\x06') {
              return unaff_EBP;
            }
            break;
          }
        }
        local_838[iVar8].message = 0;
        local_838[iVar8].timestamp = when;
        iVar5 = 0;
      }
      local_838[iVar8].message = local_838[iVar8].message | (uint)*msg << ((byte)iVar5 & 0x1f);
      iVar5 = iVar5 + 8;
    } while (*msg != 0xf7);
    iVar5 = (iVar8 + 1) - (uint)(iVar5 == 0);
  }
  if ((iVar5 == 0) || (PVar4 = Pm_Write(stream,local_838,iVar5), PVar4 == pmNoData)) {
    PVar4 = pmNoData;
  }
  return PVar4;
}

Assistant:

PMEXPORT PmError Pm_WriteSysEx(PortMidiStream *stream, PmTimestamp when, 
                      unsigned char *msg)
{
    /* allocate buffer space for PM_DEFAULT_SYSEX_BUFFER_SIZE bytes */
    /* each PmEvent holds sizeof(PmMessage) bytes of sysex data */
    #define BUFLEN ((int) (PM_DEFAULT_SYSEX_BUFFER_SIZE / sizeof(PmMessage)))
    PmEvent buffer[BUFLEN];
    int buffer_size = 1; /* first time, send 1. After that, it's BUFLEN */
    PmInternal *midi = (PmInternal *) stream;
    /* the next byte in the buffer is represented by an index, bufx, and
       a shift in bits */
    int shift = 0;
    int bufx = 0;
    buffer[0].message = 0;
    buffer[0].timestamp = when;

    while (1) {
        /* insert next byte into buffer */
        buffer[bufx].message |= ((*msg) << shift);
        shift += 8;
        if (*msg++ == MIDI_EOX) break;
        if (shift == 32) {
            shift = 0;
            bufx++;
            if (bufx == buffer_size) {
                PmError err = Pm_Write(stream, buffer, buffer_size);
                /* note: Pm_Write has already called errmsg() */
                if (err) return err;
                /* prepare to fill another buffer */
                bufx = 0;
                buffer_size = BUFLEN;
                /* optimization: maybe we can just copy bytes */
                if (midi->fill_base) {
                    PmError err;
                    while (*(midi->fill_offset_ptr) < midi->fill_length) {
                        midi->fill_base[(*midi->fill_offset_ptr)++] = *msg;
                        if (*msg++ == MIDI_EOX) {
                            err = pm_end_sysex(midi);
                            if (err != pmNoError) return pm_errmsg(err);
                            goto end_of_sysex;
                        }
                    }
                    /* I thought that I could do a pm_Write here and
                     * change this if to a loop, avoiding calls in Pm_Write
                     * to the slower write_byte, but since 
                     * sysex_in_progress is true, this will not flush
                     * the buffer, and we'll infinite loop: */
                    /* err = Pm_Write(stream, buffer, 0);
                       if (err) return err; */
                    /* instead, the way this works is that Pm_Write calls
                     * write_byte on 4 bytes. The first, since the buffer
                     * is full, will flush the buffer and allocate a new
                     * one. This primes the buffer so
                     * that we can return to the loop above and fill it
                     * efficiently without a lot of function calls.
                     */
                    buffer_size = 1; /* get another message started */
                }
            }
            buffer[bufx].message = 0;
            buffer[bufx].timestamp = when;
        } 
        /* keep inserting bytes until you find MIDI_EOX */
    }
end_of_sysex:
    /* we're finished sending full buffers, but there may
     * be a partial one left.
     */
    if (shift != 0) bufx++; /* add partial message to buffer len */
    if (bufx) { /* bufx is number of PmEvents to send from buffer */
        PmError err = Pm_Write(stream, buffer, bufx);
        if (err) return err;
    }
    return pmNoError;
}